

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

void __thiscall
mjs::activation_object::activation_object
          (activation_object *this,global_object *global,
          vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
          *param_names,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  version vVar1;
  pointer pbVar2;
  gc_heap *pgVar3;
  global_object *pgVar4;
  long *plVar5;
  long lVar6;
  gc_vector<mjs::activation_object::param> *this_00;
  mjs *pmVar7;
  pointer pbVar8;
  undefined8 extraout_RDX;
  undefined8 uVar9;
  undefined8 extraout_RDX_00;
  ulong uVar10;
  int iVar11;
  mjs *this_01;
  ulong uVar12;
  undefined1 auVar13 [16];
  string is;
  object_ptr as;
  wstring_view local_b0;
  undefined4 local_9c;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  *local_98;
  undefined1 local_90 [8];
  undefined1 local_88 [32];
  undefined1 local_68 [16];
  wstring_view local_58;
  int local_44;
  global_object *local_40;
  undefined8 local_38;
  
  local_98 = param_names;
  (*(global->super_object)._vptr_object[0x13])(local_90,global,"Activation");
  local_40 = global;
  (*(global->super_object)._vptr_object[0xb])(local_68,global);
  object::object(&this->super_object,(string *)local_90,(object_ptr *)local_68);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_68);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_90);
  (this->super_object)._vptr_object = (_func_int **)&PTR_get_001cd118;
  this->arguments_ = 0;
  this->params_ = 0;
  pbVar8 = (local_98->
           super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (local_98->
           super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar8 != pbVar2) {
    pgVar3 = (this->super_object).heap_;
    local_68._0_4_ = (undefined4)((ulong)((long)pbVar2 - (long)pbVar8) >> 5);
    gc_heap::
    allocate_and_construct<mjs::gc_vector<mjs::activation_object::param>,mjs::gc_heap&,unsigned_int&>
              ((gc_heap *)local_90,(size_t)pgVar3,(gc_heap *)0x10,(uint *)pgVar3);
    (this->params_).pos_ = local_88._0_4_;
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_90);
  }
  pgVar4 = local_40;
  vVar1 = local_40->version_;
  if ((int)vVar1 < 2) {
    local_9c = 0;
  }
  else {
    local_9c = (undefined4)
               CONCAT71((int7)((ulong)local_40->strict_mode_ >> 8),*local_40->strict_mode_);
  }
  global_object::make_arguments_array((global_object *)local_68);
  (this->arguments_).pos_ = local_68._8_4_;
  plVar5 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_68);
  (*(pgVar4->super_object)._vptr_object[0x13])(&local_b0,pgVar4,"length");
  lVar6 = ((long)(args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
  auVar13._8_4_ = (int)((ulong)lVar6 >> 0x20);
  auVar13._0_8_ = lVar6;
  auVar13._12_4_ = 0x45300000;
  local_88._0_8_ =
       (auVar13._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0);
  local_90._0_4_ = number;
  (**(code **)(*plVar5 + 8))(plVar5,&local_b0,local_90,2);
  value::destroy((value *)local_90);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_b0);
  if ((args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    local_38 = &this->params_;
    iVar11 = (uint)((int)vVar1 < 2) * 2;
    this_01 = (mjs *)0x0;
    uVar9 = extraout_RDX;
    local_44 = iVar11;
    do {
      pgVar3 = (this->super_object).heap_;
      index_string_abi_cxx11_((wstring *)local_90,this_01,(uint32_t)uVar9);
      local_58._M_str = (wchar_t *)CONCAT44(local_90._4_4_,local_90._0_4_);
      local_58._M_len = local_88._0_8_;
      string::string((string *)&local_b0,pgVar3,&local_58);
      if ((undefined1 *)CONCAT44(local_90._4_4_,local_90._0_4_) != local_88 + 8) {
        operator_delete((undefined1 *)CONCAT44(local_90._4_4_,local_90._0_4_),
                        CONCAT44(local_88._12_4_,local_88._8_4_) * 4 + 4);
      }
      plVar5 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_68);
      (**(code **)(*plVar5 + 8))
                (plVar5,&local_b0,
                 (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                 super__Vector_impl_data._M_start + (long)this_01,iVar11);
      pbVar8 = (local_98->
               super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (this_01 < (mjs *)((long)(local_98->
                                  super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5))
      {
        if ((char)local_9c == '\0') {
          this_00 = gc_heap_ptr_untracked<mjs::gc_vector<mjs::activation_object::param>,_true>::
                    dereference((gc_heap_ptr_untracked<mjs::gc_vector<mjs::activation_object::param>,_true>
                                 *)local_38,(this->super_object).heap_);
          pbVar8 = (local_98->
                   super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          local_58._M_str = pbVar8[(long)this_01]._M_dataplus._M_p;
          local_58._M_len = pbVar8[(long)this_01]._M_string_length;
          string::string((string *)local_90,(this->super_object).heap_,&local_58);
          gc_vector<mjs::activation_object::param>::emplace_back<mjs::string,mjs::string&>
                    (this_00,(string *)local_90,(string *)&local_b0);
          gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_90);
        }
        else {
          local_58._M_str = pbVar8[(long)this_01]._M_dataplus._M_p;
          local_58._M_len = pbVar8[(long)this_01]._M_string_length;
          string::string((string *)local_90,(this->super_object).heap_,&local_58);
          object::put(&this->super_object,(string *)local_90,
                      (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                      super__Vector_impl_data._M_start + (long)this_01,dont_delete);
          gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_90);
          iVar11 = local_44;
        }
      }
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_b0);
      this_01 = (mjs *)(ulong)((int)this_01 + 1);
      pmVar7 = (mjs *)(((long)(args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>).
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)(args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>).
                              _M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333);
      uVar9 = extraout_RDX_00;
    } while (this_01 <= pmVar7 && (long)pmVar7 - (long)this_01 != 0);
  }
  (*(local_40->super_object)._vptr_object[0x13])(&local_b0,local_40,"arguments");
  local_90._0_4_ = object;
  local_88._0_8_ = CONCAT44(local_68._4_4_,local_68._0_4_);
  local_88._8_4_ = local_68._8_4_;
  if ((gc_heap *)local_88._0_8_ != (gc_heap *)0x0) {
    gc_heap::attach((gc_heap *)local_88._0_8_,(gc_heap_ptr_untyped *)local_88);
  }
  object::put(&this->super_object,(string *)&local_b0,(value *)local_90,dont_delete);
  value::destroy((value *)local_90);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_b0);
  if ((char)local_9c == '\0') {
    uVar12 = 0;
  }
  else {
    uVar12 = ((long)(args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
  }
  pbVar8 = (local_98->
           super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (uVar12 < (ulong)((long)(local_98->
                             super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5)) {
    uVar10 = uVar12 << 5 | 8;
    do {
      local_b0._M_str = *(wchar_t **)((long)pbVar8 + (uVar10 - 8));
      local_b0._M_len = *(size_t *)((long)&(pbVar8->_M_dataplus)._M_p + uVar10);
      string::string((string *)local_90,(this->super_object).heap_,&local_b0);
      object::put(&this->super_object,(string *)local_90,(value *)&value::undefined,dont_delete);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_90);
      uVar12 = uVar12 + 1;
      pbVar8 = (local_98->
               super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar10 = uVar10 + 0x20;
    } while (uVar12 < (ulong)((long)(local_98->
                                    super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5)
            );
  }
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_68);
  return;
}

Assistant:

explicit activation_object(global_object& global, const std::vector<std::wstring>& param_names, const std::vector<value>& args)
        : object(global.common_string("Activation"), global.object_prototype()) {

        if (!param_names.empty()) {
            params_ = gc_vector<param>::make(heap(), static_cast<uint32_t>(param_names.size()));
        }

        const auto ver    = global.language_version();
        const bool strict = ver >= version::es5 && global.strict_mode();

        // Arguments array
        auto as = global.make_arguments_array();
        arguments_ = as;
        as->put(global.common_string("length"), value{static_cast<double>(args.size())}, property_attribute::dont_enum);
        for (uint32_t i = 0; i < args.size(); ++i) {
            string is{heap(), index_string(i)};
            as->put(is, args[i], ver >= version::es5 ? property_attribute::none : property_attribute::dont_enum);

            if (i < param_names.size()) {
                if (!strict) {
                    // Handle the (ugly) fact that the arguments array aliases the parameters
                    params_.dereference(heap()).emplace_back(string{heap(), param_names[i]}, is);
                } else {
                    object::put(string{heap(), param_names[i]}, args[i], property_attribute::dont_delete);
                }
            }
        }

        object::put(global.common_string("arguments"), value{as}, property_attribute::dont_delete);

        // Add placeholders (see note above)
        for (size_t i = strict ? args.size() : 0; i < param_names.size(); ++i) {
            object::put(string{heap(), param_names[i]}, value::undefined, property_attribute::dont_delete);
        }
    }